

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void X25519_keypair(uint8_t *out_public_value,uint8_t *out_private_key)

{
  uint8_t *out_private_key_local;
  uint8_t *out_public_value_local;
  
  RAND_bytes(out_private_key,0x20);
  *out_private_key = *out_private_key | 7;
  out_private_key[0x1f] = out_private_key[0x1f] & 0xbf;
  out_private_key[0x1f] = out_private_key[0x1f] | 0x80;
  X25519_public_from_private(out_public_value,out_private_key);
  return;
}

Assistant:

void X25519_keypair(uint8_t out_public_value[32], uint8_t out_private_key[32]) {
  RAND_bytes(out_private_key, 32);

  // All X25519 implementations should decode scalars correctly (see
  // https://tools.ietf.org/html/rfc7748#section-5). However, if an
  // implementation doesn't then it might interoperate with random keys a
  // fraction of the time because they'll, randomly, happen to be correctly
  // formed.
  //
  // Thus we do the opposite of the masking here to make sure that our private
  // keys are never correctly masked and so, hopefully, any incorrect
  // implementations are deterministically broken.
  //
  // This does not affect security because, although we're throwing away
  // entropy, a valid implementation of scalarmult should throw away the exact
  // same bits anyway.
  out_private_key[0] |= ~248;
  out_private_key[31] &= ~64;
  out_private_key[31] |= ~127;

  X25519_public_from_private(out_public_value, out_private_key);
}